

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

UINT8 gb_sound_r(void *chip,UINT8 offset)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  gb_sound_t *gb;
  UINT8 offset_local;
  void *chip_local;
  
  if (offset < 0x20) {
    if (*(char *)((long)chip + 0xdc) == '\0') {
      chip_local._7_1_ = gb_sound_r::read_mask[(int)(offset & 0x3f)];
    }
    else if (offset == '\x16') {
      bVar1 = 0;
      if ((*(byte *)((long)chip + 0x45) & 1) != 0) {
        bVar1 = 2;
      }
      bVar2 = 0;
      if ((*(byte *)((long)chip + 0x79) & 1) != 0) {
        bVar2 = 4;
      }
      bVar3 = 0;
      if ((*(byte *)((long)chip + 0xad) & 1) != 0) {
        bVar3 = 8;
      }
      chip_local._7_1_ =
           *(byte *)((long)chip + 0x106) & 0xf0 | (*(byte *)((long)chip + 0x11) & 1) != 0 | bVar1 |
           bVar2 | bVar3 | 0x70;
    }
    else {
      chip_local._7_1_ =
           *(byte *)((long)chip + (ulong)offset + 0xf0) |
           gb_sound_r::read_mask[(int)(offset & 0x3f)];
    }
  }
  else if (offset < 0x30) {
    chip_local._7_1_ = gb_wave_r(chip,offset + 0xe0);
  }
  else {
    chip_local._7_1_ = 0xff;
  }
  return chip_local._7_1_;
}

Assistant:

static UINT8 gb_sound_r(void *chip, UINT8 offset)
{
	static const UINT8 read_mask[0x40] =
	{
		0x80,0x3F,0x00,0xFF,0xBF,0xFF,0x3F,0x00,0xFF,0xBF,0x7F,0xFF,0x9F,0xFF,0xBF,0xFF,
		0xFF,0x00,0x00,0xBF,0x00,0x00,0x70,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
		0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,
		0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00,0x00
	};
	gb_sound_t *gb = (gb_sound_t *)chip;

	//gb_update_state(gb, 0);

	if (offset < AUD3W0)
	{
		if (gb->snd_control.on)
		{
			if (offset == NR52)
			{
				return (gb->snd_regs[NR52]&0xf0) | (gb->snd_1.on ? 1 : 0) | (gb->snd_2.on ? 2 : 0) | (gb->snd_3.on ? 4 : 0) | (gb->snd_4.on ? 8 : 0) | 0x70;
			}
			return gb->snd_regs[offset] | read_mask[offset & 0x3F];
		}
		else
		{
			return read_mask[offset & 0x3F];
		}
	}
	else if (offset <= AUD3WF)
	{
		return gb_wave_r(gb, offset - AUD3W0);
	}
	return 0xFF;
}